

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.hpp
# Opt level: O0

size_t __thiscall
io::detail::memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>::
read_some<io::net::mutable_buffer>
          (memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>
           *this,mutable_buffer *mb,error_code *ec)

{
  long lVar1;
  error_code *dest;
  size_type sVar2;
  size_t sVar3;
  const_buffer local_38;
  size_t bytes_copied;
  error_code *ec_local;
  mutable_buffer *mb_local;
  memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long> *this_local;
  
  bytes_copied = (size_t)ec;
  ec_local = (error_code *)mb;
  mb_local = (mutable_buffer *)this;
  std::error_code::clear(ec);
  lVar1 = this->pos_;
  sVar2 = size(this);
  if (lVar1 == sVar2) {
    std::error_code::operator=((error_code *)bytes_copied,eof);
  }
  dest = ec_local;
  local_38 = buffer(this);
  sVar3 = net::buffer_copy((mutable_buffer *)dest,&local_38);
  this->pos_ = sVar3 + this->pos_;
  return sVar3;
}

Assistant:

std::size_t read_some(const MutBufSeq& mb, std::error_code& ec) noexcept
    {
        static_assert(io::is_mutable_buffer_sequence_v<MutBufSeq>,
                      "Argument passed to read_some() is not a MutableBufferSequence");

        ec.clear();

        if (pos_ == this->size()) {
            ec = stream_errc::eof;
        }

        auto bytes_copied = io::buffer_copy(mb, this->buffer());
        pos_ += bytes_copied;

        return bytes_copied;
    }